

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

int btrimws(bstring b)

{
  ulong uVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  uchar *puVar5;
  long lVar6;
  ushort **ppuVar7;
  byte *pbVar8;
  int iVar9;
  ulong uVar10;
  
  iVar9 = -1;
  if (((b != (bstring)0x0) && (puVar5 = b->data, puVar5 != (uchar *)0x0)) &&
     (iVar3 = b->mlen, 0 < iVar3)) {
    uVar4 = b->slen;
    if (((int)uVar4 <= iVar3) && (-1 < (int)uVar4)) {
      uVar10 = (ulong)uVar4 + 1;
      while (uVar1 = uVar10 - 1, 0 < (long)uVar1) {
        ppuVar7 = __ctype_b_loc();
        lVar6 = uVar10 - 2;
        uVar10 = uVar1;
        if ((*(byte *)((long)*ppuVar7 + (ulong)puVar5[lVar6] * 2 + 1) & 0x20) == 0) {
          if ((int)uVar1 <= iVar3) {
            puVar5[uVar1 & 0xffffffff] = '\0';
          }
          b->slen = (int)uVar1;
          pbVar8 = b->data;
          iVar9 = -1;
          do {
            bVar2 = *pbVar8;
            iVar9 = iVar9 + 1;
            pbVar8 = pbVar8 + 1;
          } while ((*(byte *)((long)*ppuVar7 + (ulong)bVar2 * 2 + 1) & 0x20) != 0);
          iVar9 = bdelete(b,0,iVar9);
          return iVar9;
        }
      }
      *puVar5 = '\0';
      b->slen = 0;
      iVar9 = 0;
    }
  }
  return iVar9;
}

Assistant:

int btrimws (bstring b) {
int i, j;

	if (b == NULL || b->data == NULL || b->mlen < b->slen ||
	    b->slen < 0 || b->mlen <= 0) return BSTR_ERR;

	for (i = b->slen - 1; i >= 0; i--) {
		if (!wspace (b->data[i])) {
			if (b->mlen > i) b->data[i+1] = (unsigned char) '\0';
			b->slen = i + 1;
			for (j = 0; wspace (b->data[j]); j++) {}
			return bdelete (b, 0, j);
		}
	}

	b->data[0] = (unsigned char) '\0';
	b->slen = 0;
	return BSTR_OK;
}